

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O0

void vrfy_children(basic_block *bb)

{
  instruction *piVar1;
  undefined1 local_58 [8];
  ptr_list_iter tmpiter__;
  ptr_list_iter jmpiter__;
  instruction *br;
  basic_block *tmp;
  basic_block *bb_local;
  
  piVar1 = dmrC_last_instruction(bb->insns);
  if (piVar1 == (instruction *)0x0) {
    if (bb->children != (basic_block_list *)0x0) {
      __assert_fail("!bb->children",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/flow.c"
                    ,0x368,"void vrfy_children(struct basic_block *)");
    }
  }
  else {
    switch(*(undefined1 *)piVar1) {
    case 4:
      vrfy_bb_in_list((piVar1->field_6).field_1.bb_false,bb->children);
    case 3:
      vrfy_bb_in_list((piVar1->field_6).field_1.bb_true,bb->children);
      break;
    case 5:
    case 7:
      ptrlist_forward_iterator
                ((ptr_list_iter *)&tmpiter__.__nr,(ptr_list *)(piVar1->field_6).field_1.bb_true);
      jmpiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&tmpiter__.__nr);
      while (jmpiter__._16_8_ != 0) {
        vrfy_bb_in_list(*(basic_block **)jmpiter__._16_8_,bb->children);
        jmpiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&tmpiter__.__nr);
      }
      break;
    default:
    }
    ptrlist_forward_iterator((ptr_list_iter *)local_58,(ptr_list *)bb->children);
    br = (instruction *)ptrlist_iter_next((ptr_list_iter *)local_58);
    while (br != (instruction *)0x0) {
      vrfy_bb_in_list(bb,(basic_block_list *)(br->field_5).target);
      br = (instruction *)ptrlist_iter_next((ptr_list_iter *)local_58);
    }
  }
  return;
}

Assistant:

static void vrfy_children(struct basic_block *bb)
{
	struct basic_block *tmp;
	struct instruction *br = dmrC_last_instruction(bb->insns);

	if (!br) {
		assert(!bb->children);
		return;
	}
	switch (br->opcode) {
		struct multijmp *jmp;
	case OP_CBR:
		vrfy_bb_in_list(br->bb_false, bb->children);
		/* fall through */
	case OP_BR:
		vrfy_bb_in_list(br->bb_true, bb->children);
		break;
	case OP_SWITCH:
	case OP_COMPUTEDGOTO:
		FOR_EACH_PTR(br->multijmp_list, jmp) {
			vrfy_bb_in_list(jmp->target, bb->children);
		} END_FOR_EACH_PTR(jmp);
		break;
	default:
		break;
	}
		
	FOR_EACH_PTR(bb->children, tmp) {
		vrfy_bb_in_list(bb, tmp->parents);
	} END_FOR_EACH_PTR(tmp);
}